

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expert_encode.cc
# Opt level: O3

Status * __thiscall
draco::ExpertEncoder::EncodeMeshToBuffer
          (Status *__return_storage_ptr__,ExpertEncoder *this,Mesh *m,EncoderBuffer *out_buffer)

{
  EncoderOptionsBase<int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  MeshEdgebreakerEncoder *this_01;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"encoding_method","");
  this_00 = &(this->super_EncoderBase<draco::EncoderOptionsBase<int>_>).options_;
  iVar3 = Options::GetInt((Options *)this_00,&local_50,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 1) {
LAB_00125e2c:
    this_01 = (MeshEdgebreakerEncoder *)operator_new(0x88);
    MeshEdgebreakerEncoder::MeshEdgebreakerEncoder(this_01);
  }
  else {
    if (iVar3 == -1) {
      iVar3 = EncoderOptionsBase<int>::GetSpeed(this_00);
      if (iVar3 != 10) goto LAB_00125e2c;
    }
    this_01 = (MeshEdgebreakerEncoder *)operator_new(0x80);
    MeshSequentialEncoder::MeshSequentialEncoder((MeshSequentialEncoder *)this_01);
  }
  MeshEncoder::SetMesh(&this_01->super_MeshEncoder,m);
  PointCloudEncoder::Encode(__return_storage_ptr__,(PointCloudEncoder *)this_01,this_00,out_buffer);
  if (__return_storage_ptr__->code_ == OK) {
    pcVar2 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    (this->super_EncoderBase<draco::EncoderOptionsBase<int>_>).num_encoded_points_ =
         (this_01->super_MeshEncoder).super_PointCloudEncoder.num_encoded_points_;
    (this->super_EncoderBase<draco::EncoderOptionsBase<int>_>).num_encoded_faces_ =
         (this_01->super_MeshEncoder).num_encoded_faces_;
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  (*(this_01->super_MeshEncoder).super_PointCloudEncoder._vptr_PointCloudEncoder[1])(this_01);
  return __return_storage_ptr__;
}

Assistant:

Status ExpertEncoder::EncodeMeshToBuffer(const Mesh &m,
                                         EncoderBuffer *out_buffer) {
#ifdef DRACO_TRANSCODER_SUPPORTED
  // Apply DracoCompressionOptions associated with the mesh.
  DRACO_RETURN_IF_ERROR(ApplyCompressionOptions(m));
#endif  // DRACO_TRANSCODER_SUPPORTED

  std::unique_ptr<MeshEncoder> encoder;
  // Select the encoding method only based on the provided options.
  int encoding_method = options().GetGlobalInt("encoding_method", -1);
  if (encoding_method == -1) {
    // For now select the edgebreaker for all options expect of speed 10
    if (options().GetSpeed() == 10) {
      encoding_method = MESH_SEQUENTIAL_ENCODING;
    } else {
      encoding_method = MESH_EDGEBREAKER_ENCODING;
    }
  }
  if (encoding_method == MESH_EDGEBREAKER_ENCODING) {
    encoder = std::unique_ptr<MeshEncoder>(new MeshEdgebreakerEncoder());
  } else {
    encoder = std::unique_ptr<MeshEncoder>(new MeshSequentialEncoder());
  }
  encoder->SetMesh(m);

  DRACO_RETURN_IF_ERROR(encoder->Encode(options(), out_buffer));

  set_num_encoded_points(encoder->num_encoded_points());
  set_num_encoded_faces(encoder->num_encoded_faces());
  return OkStatus();
}